

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomDepends
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs)

{
  pointer pcVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  pointer cc;
  cmCustomCommandGenerator ccg;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf0;
  undefined1 local_200 [16];
  bool local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  code *local_1d8;
  undefined8 uStack_1d0;
  string local_1c0;
  cmCustomCommandGenerator local_190;
  
  cc = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pcVar1 = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (cc != pcVar1) {
    do {
      GetConfigName_abi_cxx11_(&local_1c0,this);
      local_1f0 = false;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1d8 = (code *)0x0;
      uStack_1d0 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffde0;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_1e8;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)depends;
      computeInternalDepfile._M_invoker = (_Invoker_type)in_stack_fffffffffffffdf0;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_190,cc,&local_1c0,(cmLocalGenerator *)this,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffdf0,computeInternalDepfile);
      if (local_1d8 != (code *)0x0) {
        (*local_1d8)(&local_1e8,&local_1e8,3);
      }
      if (local_1f0 == true) {
        local_1f0 = false;
        if ((undefined1 *)in_stack_fffffffffffffdf0 != local_200) {
          operator_delete((void *)in_stack_fffffffffffffdf0,local_200._0_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      AppendCustomDepend(this,depends,&local_190);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_190);
      cc = cc + 1;
    } while (cc != pcVar1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomDepends(
  std::vector<std::string>& depends, const std::vector<cmCustomCommand>& ccs)
{
  for (cmCustomCommand const& cc : ccs) {
    cmCustomCommandGenerator ccg(cc, this->GetConfigName(), this);
    this->AppendCustomDepend(depends, ccg);
  }
}